

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionObject.cpp
# Opt level: O0

void __thiscall Js::JavascriptExceptionObject::FillStackBackTrace(JavascriptExceptionObject *this)

{
  StackBackTrace **ppSVar1;
  ScriptContext **ppSVar2;
  ScriptContext *this_00;
  ThreadContext *this_01;
  StackBackTrace *ptr;
  OutOfMemoryException anon_var_0;
  AutoNestedHandledExceptionType local_20;
  undefined4 local_1c;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  HRESULT hr;
  Recycler *recycler;
  JavascriptExceptionObject *this_local;
  
  ppSVar1 = Memory::WriteBarrierPtr::operator_cast_to_StackBackTrace__
                      ((WriteBarrierPtr *)&this->stackBackTrace);
  if (*ppSVar1 == (StackBackTrace *)0x0) {
    ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                        ((WriteBarrierPtr *)&this->scriptContext);
    if (*ppSVar2 != (ScriptContext *)0x0) {
      this_00 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->(&this->scriptContext);
      this_01 = ScriptContext::GetThreadContext(this_00);
      ___autoNestedHandledExceptionType = ThreadContext::GetRecycler(this_01);
      local_1c = 0;
      AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                (&local_20,ExceptionType_OutOfMemory);
      ptr = StackBackTrace::Capture<Memory::Recycler>(___autoNestedHandledExceptionType,2,0x1e);
      Memory::WriteBarrierPtr<StackBackTrace>::operator=(&this->stackBackTrace,ptr);
      AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(&local_20);
    }
  }
  return;
}

Assistant:

void JavascriptExceptionObject::FillStackBackTrace()
    {
        // Note: this->scriptContext can be NULL when we throw Out Of Memory exception.
        if (this->stackBackTrace == NULL && this->scriptContext != NULL)
        {
            Recycler* recycler = scriptContext->GetThreadContext()->GetRecycler();
            HRESULT hr = NOERROR;
            BEGIN_TRANSLATE_OOM_TO_HRESULT_NESTED
            {
                this->stackBackTrace = StackBackTrace::Capture(recycler, JavascriptExceptionObject::StackToSkip, JavascriptExceptionObject::StackTraceDepth);
            }
            END_TRANSLATE_OOM_TO_HRESULT(hr)
        }
    }